

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player-birth.c
# Opt level: O0

void save_roller_data(birther *tosave)

{
  int local_14;
  wchar_t i;
  birther *tosave_local;
  
  tosave->race = player->race;
  tosave->class = player->class;
  tosave->age = player->age;
  tosave->wt = player->wt_birth;
  tosave->ht = player->ht_birth;
  tosave->au = player->au_birth;
  for (local_14 = 0; local_14 < 5; local_14 = local_14 + 1) {
    tosave->stat[local_14] = player->stat_birth[local_14];
  }
  if (tosave->history != (char *)0x0) {
    string_free(tosave->history);
  }
  tosave->history = player->history;
  player->history = (char *)0x0;
  my_strcpy(tosave->name,player->full_name,0x20);
  return;
}

Assistant:

static void save_roller_data(birther *tosave)
{
	int i;

	/* Save the data */
	tosave->race = player->race;
	tosave->class = player->class;
	tosave->age = player->age;
	tosave->wt = player->wt_birth;
	tosave->ht = player->ht_birth;
	tosave->au = player->au_birth;

	/* Save the stats */
	for (i = 0; i < STAT_MAX; i++)
		tosave->stat[i] = player->stat_birth[i];

	if (tosave->history) {
		string_free(tosave->history);
	}
	tosave->history = player->history;
	player->history = NULL;
	my_strcpy(tosave->name, player->full_name, sizeof(tosave->name));
}